

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * __thiscall
cimg_library::CImgList<unsigned_char>::get_append
          (CImgList<unsigned_char> *this,char axis,float align)

{
  bool bVar1;
  char cVar2;
  CImg<unsigned_char> *pCVar3;
  uchar *puVar4;
  char in_DL;
  CImgList<unsigned_char> *in_RSI;
  CImg<unsigned_char> *in_RDI;
  int l_7;
  CImg<unsigned_char> *img_3;
  int l_6;
  int l_5;
  CImg<unsigned_char> *img_2;
  int l_4;
  int l_3;
  CImg<unsigned_char> *img_1;
  int l_2;
  int l_1;
  CImg<unsigned_char> *img;
  int l;
  uint pos;
  uint dc;
  uint dz;
  uint dy;
  uint dx;
  CImg<unsigned_char> *res;
  undefined7 in_stack_fffffffffffffdc8;
  uchar in_stack_fffffffffffffdcf;
  undefined8 in_stack_fffffffffffffdd0;
  uint in_stack_fffffffffffffdd8;
  uint in_stack_fffffffffffffddc;
  CImg<unsigned_char> *in_stack_fffffffffffffde0;
  int local_84;
  int local_78;
  int local_74;
  int local_68;
  int local_64;
  int local_54;
  int local_50;
  float in_stack_ffffffffffffffbc;
  CImg<unsigned_char> *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int z0;
  uint in_stack_ffffffffffffffd0;
  int x0;
  type_conflict2 tVar5;
  type_conflict2 tVar6;
  uint local_20;
  uint local_1c [2];
  char local_11;
  
  local_11 = in_DL;
  bVar1 = is_empty(in_RSI);
  if (bVar1) {
    CImg<unsigned_char>::CImg(in_RDI);
  }
  else if (in_RSI->_width == 1) {
    cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)in_RSI);
    CImg<unsigned_char>::operator+
              ((CImg<unsigned_char> *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8))
    ;
  }
  else {
    local_1c[0] = 0;
    local_20 = 0;
    tVar6 = 0;
    tVar5 = 0;
    x0 = 0;
    in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffd0 & 0xffffff;
    CImg<unsigned_char>::CImg(in_RDI);
    cVar2 = cimg::uncase(local_11);
    if (cVar2 == 'x') {
      for (z0 = 0; z0 < (int)in_RSI->_width; z0 = z0 + 1) {
        in_stack_ffffffffffffffc0 =
             cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)in_RSI);
        in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffc0 + z0;
        local_1c[0] = in_stack_ffffffffffffffc0->_width + local_1c[0];
        local_20 = cimg::max<unsigned_int,unsigned_int>
                             (&local_20,&in_stack_ffffffffffffffc0->_height);
        tVar6 = cimg::max<unsigned_int,unsigned_int>
                          ((uint *)&stack0xffffffffffffffdc,&in_stack_ffffffffffffffc0->_depth);
        tVar5 = cimg::max<unsigned_int,unsigned_int>
                          ((uint *)&stack0xffffffffffffffd8,&in_stack_ffffffffffffffc0->_spectrum);
      }
      CImg<unsigned_char>::assign
                (in_stack_fffffffffffffde0,in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8,
                 (uint)((ulong)in_stack_fffffffffffffdd0 >> 0x20),(uint)in_stack_fffffffffffffdd0,
                 in_stack_fffffffffffffdcf);
      puVar4 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)in_RDI);
      if (puVar4 != (uchar *)0x0) {
        for (local_50 = 0; local_50 < (int)in_RSI->_width; local_50 = local_50 + 1) {
          cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)in_RSI);
          cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)in_RSI);
          cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)in_RSI);
          cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)in_RSI);
          CImg<unsigned_char>::draw_image
                    ((CImg<unsigned_char> *)CONCAT44(tVar6,tVar5),x0,in_stack_ffffffffffffffd0,z0,
                     in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
          pCVar3 = cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)in_RSI);
          x0 = pCVar3[local_50]._width + x0;
        }
      }
    }
    else if (cVar2 == 'y') {
      for (local_54 = 0; local_54 < (int)in_RSI->_width; local_54 = local_54 + 1) {
        pCVar3 = cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)in_RSI);
        pCVar3 = pCVar3 + local_54;
        local_1c[0] = cimg::max<unsigned_int,unsigned_int>(local_1c,&pCVar3->_width);
        local_20 = pCVar3->_height + local_20;
        tVar6 = cimg::max<unsigned_int,unsigned_int>
                          ((uint *)&stack0xffffffffffffffdc,&pCVar3->_depth);
        tVar5 = cimg::max<unsigned_int,unsigned_int>
                          ((uint *)&stack0xffffffffffffffd8,&pCVar3->_spectrum);
      }
      CImg<unsigned_char>::assign
                (in_stack_fffffffffffffde0,in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8,
                 (uint)((ulong)in_stack_fffffffffffffdd0 >> 0x20),(uint)in_stack_fffffffffffffdd0,
                 in_stack_fffffffffffffdcf);
      puVar4 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)in_RDI);
      if (puVar4 != (uchar *)0x0) {
        for (local_64 = 0; local_64 < (int)in_RSI->_width; local_64 = local_64 + 1) {
          cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)in_RSI);
          cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)in_RSI);
          cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)in_RSI);
          cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)in_RSI);
          CImg<unsigned_char>::draw_image
                    ((CImg<unsigned_char> *)CONCAT44(tVar6,tVar5),x0,in_stack_ffffffffffffffd0,
                     in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                     in_stack_ffffffffffffffbc);
          pCVar3 = cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)in_RSI);
          x0 = pCVar3[local_64]._height + x0;
        }
      }
    }
    else if (cVar2 == 'z') {
      for (local_68 = 0; local_68 < (int)in_RSI->_width; local_68 = local_68 + 1) {
        pCVar3 = cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)in_RSI);
        pCVar3 = pCVar3 + local_68;
        local_1c[0] = cimg::max<unsigned_int,unsigned_int>(local_1c,&pCVar3->_width);
        local_20 = cimg::max<unsigned_int,unsigned_int>(&local_20,&pCVar3->_height);
        tVar6 = pCVar3->_depth + tVar6;
        tVar5 = cimg::max<unsigned_int,unsigned_int>
                          ((uint *)&stack0xffffffffffffffd8,&pCVar3->_spectrum);
      }
      CImg<unsigned_char>::assign
                (in_stack_fffffffffffffde0,in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8,
                 (uint)((ulong)in_stack_fffffffffffffdd0 >> 0x20),(uint)in_stack_fffffffffffffdd0,
                 in_stack_fffffffffffffdcf);
      puVar4 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)in_RDI);
      if (puVar4 != (uchar *)0x0) {
        for (local_74 = 0; local_74 < (int)in_RSI->_width; local_74 = local_74 + 1) {
          cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)in_RSI);
          cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)in_RSI);
          cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)in_RSI);
          cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)in_RSI);
          CImg<unsigned_char>::draw_image
                    ((CImg<unsigned_char> *)CONCAT44(tVar6,tVar5),x0,in_stack_ffffffffffffffd0,
                     in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                     in_stack_ffffffffffffffbc);
          pCVar3 = cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)in_RSI);
          x0 = pCVar3[local_74]._depth + x0;
        }
      }
    }
    else {
      for (local_78 = 0; local_78 < (int)in_RSI->_width; local_78 = local_78 + 1) {
        pCVar3 = cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)in_RSI);
        pCVar3 = pCVar3 + local_78;
        local_1c[0] = cimg::max<unsigned_int,unsigned_int>(local_1c,&pCVar3->_width);
        local_20 = cimg::max<unsigned_int,unsigned_int>(&local_20,&pCVar3->_height);
        tVar6 = cimg::max<unsigned_int,unsigned_int>
                          ((uint *)&stack0xffffffffffffffdc,&pCVar3->_depth);
        tVar5 = pCVar3->_spectrum + tVar5;
      }
      CImg<unsigned_char>::assign
                (in_stack_fffffffffffffde0,in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8,
                 (uint)((ulong)in_stack_fffffffffffffdd0 >> 0x20),(uint)in_stack_fffffffffffffdd0,
                 in_stack_fffffffffffffdcf);
      puVar4 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)in_RDI);
      if (puVar4 != (uchar *)0x0) {
        for (local_84 = 0; local_84 < (int)in_RSI->_width; local_84 = local_84 + 1) {
          cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)in_RSI);
          cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)in_RSI);
          cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)in_RSI);
          cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)in_RSI);
          CImg<unsigned_char>::draw_image
                    ((CImg<unsigned_char> *)CONCAT44(tVar6,tVar5),x0,in_stack_ffffffffffffffd0,
                     in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                     in_stack_ffffffffffffffbc);
          pCVar3 = cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)in_RSI);
          x0 = pCVar3[local_84]._spectrum + x0;
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

CImg<T> get_append(const char axis, const float align=0) const {
      if (is_empty()) return CImg<T>();
      if (_width==1) return +((*this)[0]);
      unsigned int dx = 0, dy = 0, dz = 0, dc = 0, pos = 0;
      CImg<T> res;
      switch (cimg::uncase(axis)) {
      case 'x' : { // Along the X-axis.
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          dx+=img._width; dy = cimg::max(dy,img._height); dz = cimg::max(dz,img._depth); dc = cimg::max(dc,img._spectrum);
        }
        res.assign(dx,dy,dz,dc,0);
        if (res) cimglist_for(*this,l) {
            res.draw_image(pos,
                           (int)(align*(dy-(*this)[l]._height)),
                           (int)(align*(dz-(*this)[l]._depth)),
                           (int)(align*(dc-(*this)[l]._spectrum)),
                           (*this)[l]);
            pos+=(*this)[l]._width;
          }
      } break;
      case 'y' : { // Along the Y-axis.
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          dx = cimg::max(dx,img._width); dy+=img._height; dz = cimg::max(dz,img._depth); dc = cimg::max(dc,img._spectrum);
        }
        res.assign(dx,dy,dz,dc,0);
        if (res) cimglist_for(*this,l) {
            res.draw_image((int)(align*(dx-(*this)[l]._width)),
                           pos,
                           (int)(align*(dz-(*this)[l]._depth)),
                           (int)(align*(dc-(*this)[l]._spectrum)),
                           (*this)[l]);
            pos+=(*this)[l]._height;
          }
      } break;
      case 'z' : { // Along the Z-axis.
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          dx = cimg::max(dx,img._width); dy = cimg::max(dy,img._height); dz+=img._depth; dc = cimg::max(dc,img._spectrum);
        }
        res.assign(dx,dy,dz,dc,0);
        if (res) cimglist_for(*this,l) {
            res.draw_image((int)(align*(dx-(*this)[l]._width)),
                           (int)(align*(dy-(*this)[l]._height)),
                           pos,
                           (int)(align*(dc-(*this)[l]._spectrum)),
                           (*this)[l]);
            pos+=(*this)[l]._depth;
          }
      } break;
      default : { // Along the C-axis.
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          dx = cimg::max(dx,img._width); dy = cimg::max(dy,img._height); dz = cimg::max(dz,img._depth); dc+=img._spectrum;
        }
        res.assign(dx,dy,dz,dc,0);
        if (res) cimglist_for(*this,l) {
            res.draw_image((int)(align*(dx-(*this)[l]._width)),
                           (int)(align*(dy-(*this)[l]._height)),
                           (int)(align*(dz-(*this)[l]._depth)),
                           pos,
                           (*this)[l]);
            pos+=(*this)[l]._spectrum;
          }
      }
      }
      return res;
    }